

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)22,_Protocol::MQTT::Common::DynamicBinaryData>::
allocateProp(void)

{
  PropertyBase *this;
  DynamicBinaryData local_1a;
  
  this = (PropertyBase *)operator_new(0x30);
  Common::DynamicBinaryData::DynamicBinaryData(&local_1a,0,(uint8 *)0x0);
  Property<Protocol::MQTT::Common::DynamicBinaryData>::Property
            ((Property<Protocol::MQTT::Common::DynamicBinaryData> *)this,AuthenticationData,
             &local_1a,true);
  Common::DynamicBinaryData::~DynamicBinaryData(&local_1a);
  return this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }